

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O0

void prettyPrintMachine(Machine *m)

{
  bool bVar1;
  ostream *poVar2;
  reference ppVar3;
  reference ppVar4;
  Hcell local_138;
  int local_104;
  undefined1 local_100 [8];
  pair<const_Register,_Hcell> it_1;
  iterator __end1_1;
  iterator __begin1_1;
  map<Register,_Hcell,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  *__range1_1;
  int local_6c;
  undefined1 local_68 [8];
  pair<const_Hix,_Hcell> it;
  iterator __end1;
  iterator __begin1;
  map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_> *__range1;
  Machine *m_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"H: ");
  poVar2 = operator<<(poVar2,(Hix)(m->h).hix);
  poVar2 = std::operator<<(poVar2,"|S: ");
  poVar2 = operator<<(poVar2,(Hix)(m->s).hix);
  std::operator<<(poVar2,"\n");
  std::operator<<((ostream *)&std::cout,"Heap:\n");
  __end1 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
           begin(&m->heap);
  it.second.f_._32_8_ =
       std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::end
                 (&m->heap);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&it.second.f_.arity);
    if (!bVar1) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_Hix,_Hcell>_>::operator*(&__end1);
    std::pair<const_Hix,_Hcell>::pair((pair<const_Hix,_Hcell> *)local_68,ppVar3);
    local_6c = local_68._0_4_;
    poVar2 = operator<<((ostream *)&std::cout,(Hix)local_68._0_4_);
    poVar2 = std::operator<<(poVar2," -> ");
    Hcell::Hcell((Hcell *)&__range1_1,(Hcell *)&it);
    operator<<(poVar2,(Hcell *)&__range1_1);
    Hcell::~Hcell((Hcell *)&__range1_1);
    std::operator<<((ostream *)&std::cout,"\n");
    std::pair<const_Hix,_Hcell>::~pair((pair<const_Hix,_Hcell> *)local_68);
    std::_Rb_tree_iterator<std::pair<const_Hix,_Hcell>_>::operator++(&__end1);
  }
  std::operator<<((ostream *)&std::cout,"\n--\n");
  std::operator<<((ostream *)&std::cout,"Registers:\n");
  __end1_1 = std::
             map<Register,_Hcell,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
             ::begin(&m->regval);
  it_1.second.f_._32_8_ =
       std::
       map<Register,_Hcell,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
       ::end(&m->regval);
  while( true ) {
    bVar1 = std::operator!=(&__end1_1,(_Self *)&it_1.second.f_.arity);
    if (!bVar1) break;
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_Register,_Hcell>_>::operator*(&__end1_1);
    std::pair<const_Register,_Hcell>::pair((pair<const_Register,_Hcell> *)local_100,ppVar4);
    local_104 = local_100._0_4_;
    poVar2 = operator<<((ostream *)&std::cout,(Register)local_100._0_4_);
    poVar2 = std::operator<<(poVar2," -> ");
    Hcell::Hcell(&local_138,(Hcell *)&it_1);
    operator<<(poVar2,&local_138);
    Hcell::~Hcell(&local_138);
    std::operator<<((ostream *)&std::cout,"\n");
    std::pair<const_Register,_Hcell>::~pair((pair<const_Register,_Hcell> *)local_100);
    std::_Rb_tree_iterator<std::pair<const_Register,_Hcell>_>::operator++(&__end1_1);
  }
  std::operator<<((ostream *)&std::cout,"\n--\n");
  return;
}

Assistant:

void prettyPrintMachine(Machine m) {
    // H, S
    std::cout << "H: " << m.h << "|S: " << m.s << "\n";

    std::cout << "Heap:\n";
    for (auto it : m.heap) {
        std::cout << it.first << " -> " << it.second;
        std::cout << "\n";
    }
    std::cout << "\n--\n";

    std::cout << "Registers:\n";
    for (auto it : m.regval) {
        std::cout << it.first << " -> " << it.second;
        std::cout << "\n";
    }
    std::cout << "\n--\n";
}